

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

type_conflict2 __thiscall
args::ValueReader::operator()(ValueReader *this,string *name,string *value,long *destination)

{
  uint uVar1;
  istream *piVar2;
  long lVar3;
  ostream *poVar4;
  ParseError *this_00;
  string local_340;
  istringstream ss;
  ostringstream problem;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)value,_S_in);
  piVar2 = std::istream::_M_extract<long>((long *)&ss);
  uVar1 = *(uint *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    std::ws<char,std::char_traits<char>>((istream *)&ss);
  }
  lVar3 = std::streambuf::in_avail();
  if (((uVar1 & 5) == 0) && (lVar3 < 1)) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&problem);
  poVar4 = std::operator<<((ostream *)&problem,"Argument \'");
  poVar4 = std::operator<<(poVar4,(string *)name);
  poVar4 = std::operator<<(poVar4,"\' received invalid value type \'");
  poVar4 = std::operator<<(poVar4,(string *)value);
  std::operator<<(poVar4,"\'");
  this_00 = (ParseError *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  ParseError::ParseError(this_00,&local_340);
  __cxa_throw(this_00,&ParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename std::enable_if<!std::is_assignable<T, std::string>::value, bool>::type
        operator ()(const std::string &name, const std::string &value, T &destination)
        {
            std::istringstream ss(value);
            bool failed = !(ss >> destination);

            if (!failed)
            {
                ss >> std::ws;
            }

            if (ss.rdbuf()->in_avail() > 0 || failed)
            {
#ifdef ARGS_NOEXCEPT
                (void)name;
                return false;
#else
                std::ostringstream problem;
                problem << "Argument '" << name << "' received invalid value type '" << value << "'";
                throw ParseError(problem.str());
#endif
            }
            return true;
        }